

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleStringCollection::allocate(SimpleStringCollection *this,size_t _size)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  SimpleString *this_00;
  ulong uVar3;
  ulong *puVar4;
  SimpleString *pSVar5;
  size_t sVar6;
  SimpleString *local_78;
  size_t _size_local;
  SimpleStringCollection *this_local;
  
  pSVar5 = this->collection_;
  if (pSVar5 != (SimpleString *)0x0) {
    sVar6 = pSVar5[-1].bufferSize_;
    this_00 = pSVar5 + sVar6;
    while (pSVar5 != this_00) {
      this_00 = this_00 + -1;
      SimpleString::~SimpleString(this_00);
    }
    operator_delete__(&pSVar5[-1].bufferSize_,sVar6 * 0x10 + 8);
  }
  this->size_ = _size;
  uVar1 = this->size_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  sVar6 = uVar3 + 8;
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    sVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(sVar6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                                   ,0x425);
  *puVar4 = uVar1;
  pSVar5 = (SimpleString *)(puVar4 + 1);
  if (uVar1 != 0) {
    local_78 = pSVar5;
    do {
      SimpleString::SimpleString(local_78,"");
      local_78 = local_78 + 1;
    } while (local_78 != pSVar5 + uVar1);
  }
  this->collection_ = pSVar5;
  return;
}

Assistant:

void SimpleStringCollection::allocate(size_t _size)
{
    delete[] collection_;

    size_ = _size;
    collection_ = new SimpleString[size_];
}